

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct32_low16_ssse3(__m128i *input,__m128i *output)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i __rounding_04;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined2 uVar27;
  short sVar28;
  int32_t *piVar29;
  undefined8 *in_RDI;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in_15;
  __m128i _w1_15;
  __m128i _w0_15;
  __m128i _in_14;
  __m128i _w1_14;
  __m128i _w0_14;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i _in_13;
  __m128i _w1_13;
  __m128i _w0_13;
  __m128i _in_12;
  __m128i _w1_12;
  __m128i _w0_12;
  __m128i _in_11;
  __m128i _w1_11;
  __m128i _w0_11;
  __m128i _in_10;
  __m128i _w1_10;
  __m128i _w0_10;
  __m128i _in_9;
  __m128i _w1_9;
  __m128i _w0_9;
  __m128i _in_8;
  __m128i _w1_8;
  __m128i _w0_8;
  __m128i _in_7;
  __m128i _w1_7;
  __m128i _w0_7;
  __m128i _in_6;
  __m128i _w1_6;
  __m128i _w0_6;
  __m128i _in_5;
  __m128i _w1_5;
  __m128i _w0_5;
  __m128i _in_4;
  __m128i _w1_4;
  __m128i _w0_4;
  __m128i _in_3;
  __m128i _w1_3;
  __m128i _w0_3;
  __m128i _in_2;
  __m128i _w1_2;
  __m128i _w0_2;
  __m128i _in_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [32];
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  __m128i *in_stack_ffffffffffffef98;
  __m128i *output_00;
  undefined8 uVar45;
  longlong lVar46;
  longlong lVar47;
  int32_t *cospi_00;
  __m128i *x_00;
  undefined8 uVar48;
  int8_t cos_bit_01;
  longlong lVar49;
  longlong lVar50;
  int32_t *cospi_01;
  __m128i *x_01;
  undefined8 uVar51;
  longlong lVar52;
  longlong lVar53;
  int32_t *cospi_02;
  __m128i *x_02;
  undefined8 uVar54;
  int8_t cos_bit_02;
  longlong lVar55;
  longlong lVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined7 local_c38;
  undefined1 uVar59;
  int8_t cos_bit_03;
  undefined8 uVar60;
  longlong lVar61;
  undefined8 uStack_c20;
  __m128i *palStack_bf0;
  int8_t cos_bit_00;
  
  piVar29 = cospi_arr(0xc);
  uVar57 = *in_RDI;
  uVar58 = in_RDI[1];
  auVar25 = *(undefined1 (*) [16])(in_RDI + 0x10);
  auVar23 = *(undefined1 (*) [16])(in_RDI + 0x10);
  auVar43 = *(undefined1 (*) [16])(in_RDI + 8);
  auVar38 = *(undefined1 (*) [16])(in_RDI + 8);
  auVar44 = *(undefined1 (*) [16])(in_RDI + 0x18);
  auVar42 = *(undefined1 (*) [16])(in_RDI + 0x18);
  pauVar1 = (undefined1 (*) [16])(in_RDI + 4);
  x_00 = *(__m128i **)*pauVar1;
  pauVar3 = (undefined1 (*) [16])(in_RDI + 0x1a);
  lVar50 = *(longlong *)*pauVar3;
  pauVar2 = (undefined1 (*) [16])(in_RDI + 0xe);
  cospi_02 = *(int32_t **)*pauVar2;
  x_02 = (__m128i *)in_RDI[0xf];
  uVar27 = (undefined2)(piVar29[0x3e] << 3);
  lVar56 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  auVar22._10_2_ = uVar27;
  auVar22._8_2_ = uVar27;
  auVar22._12_2_ = uVar27;
  auVar22._14_2_ = uVar27;
  uVar27 = (undefined2)(piVar29[2] << 3);
  uVar54 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  lVar55 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  auVar22._0_8_ = lVar56;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 2),auVar22);
  auVar21._8_8_ = lVar55;
  auVar21._0_8_ = uVar54;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 2),auVar21);
  sVar28 = (short)piVar29[0x22] * -8;
  auVar20._2_2_ = sVar28;
  auVar20._0_2_ = sVar28;
  auVar20._4_2_ = sVar28;
  auVar20._6_2_ = sVar28;
  auVar20._10_2_ = sVar28;
  auVar20._8_2_ = sVar28;
  auVar20._12_2_ = sVar28;
  auVar20._14_2_ = sVar28;
  uVar27 = (undefined2)(piVar29[0x1e] << 3);
  auVar19._2_2_ = uVar27;
  auVar19._0_2_ = uVar27;
  auVar19._4_2_ = uVar27;
  auVar19._6_2_ = uVar27;
  auVar19._10_2_ = uVar27;
  auVar19._8_2_ = uVar27;
  auVar19._12_2_ = uVar27;
  auVar19._14_2_ = uVar27;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x1e),auVar20);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x1e),auVar19);
  uVar27 = (undefined2)(piVar29[0x2e] << 3);
  auVar18._2_2_ = uVar27;
  auVar18._0_2_ = uVar27;
  auVar18._4_2_ = uVar27;
  auVar18._6_2_ = uVar27;
  auVar18._10_2_ = uVar27;
  auVar18._8_2_ = uVar27;
  auVar18._12_2_ = uVar27;
  auVar18._14_2_ = uVar27;
  uVar27 = (undefined2)(piVar29[0x12] << 3);
  auVar17._2_2_ = uVar27;
  auVar17._0_2_ = uVar27;
  auVar17._4_2_ = uVar27;
  auVar17._6_2_ = uVar27;
  auVar17._10_2_ = uVar27;
  auVar17._8_2_ = uVar27;
  auVar17._12_2_ = uVar27;
  auVar17._14_2_ = uVar27;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x12),auVar18);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x12),auVar17);
  sVar28 = (short)piVar29[0x32] * -8;
  auVar16._2_2_ = sVar28;
  auVar16._0_2_ = sVar28;
  auVar16._4_2_ = sVar28;
  auVar16._6_2_ = sVar28;
  auVar16._10_2_ = sVar28;
  auVar16._8_2_ = sVar28;
  auVar16._12_2_ = sVar28;
  auVar16._14_2_ = sVar28;
  uVar27 = (undefined2)(piVar29[0xe] << 3);
  auVar15._2_2_ = uVar27;
  auVar15._0_2_ = uVar27;
  auVar15._4_2_ = uVar27;
  auVar15._6_2_ = uVar27;
  auVar15._10_2_ = uVar27;
  auVar15._8_2_ = uVar27;
  auVar15._12_2_ = uVar27;
  auVar15._14_2_ = uVar27;
  pmulhrsw(*pauVar2,auVar16);
  pmulhrsw(*pauVar2,auVar15);
  uVar27 = (undefined2)(piVar29[0x36] << 3);
  lVar53 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  auVar14._10_2_ = uVar27;
  auVar14._8_2_ = uVar27;
  auVar14._12_2_ = uVar27;
  auVar14._14_2_ = uVar27;
  uVar27 = (undefined2)(piVar29[10] << 3);
  uVar51 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  lVar52 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  auVar14._0_8_ = lVar53;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 10),auVar14);
  auVar13._8_8_ = lVar52;
  auVar13._0_8_ = uVar51;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 10),auVar13);
  sVar28 = (short)piVar29[0x2a] * -8;
  auVar12._2_2_ = sVar28;
  auVar12._0_2_ = sVar28;
  auVar12._4_2_ = sVar28;
  auVar12._6_2_ = sVar28;
  auVar12._10_2_ = sVar28;
  auVar12._8_2_ = sVar28;
  auVar12._12_2_ = sVar28;
  auVar12._14_2_ = sVar28;
  uVar27 = (undefined2)(piVar29[0x16] << 3);
  auVar11._2_2_ = uVar27;
  auVar11._0_2_ = uVar27;
  auVar11._4_2_ = uVar27;
  auVar11._6_2_ = uVar27;
  auVar11._10_2_ = uVar27;
  auVar11._8_2_ = uVar27;
  auVar11._12_2_ = uVar27;
  auVar11._14_2_ = uVar27;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x16),auVar12);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x16),auVar11);
  uVar27 = (undefined2)(piVar29[0x26] << 3);
  auVar10._2_2_ = uVar27;
  auVar10._0_2_ = uVar27;
  auVar10._4_2_ = uVar27;
  auVar10._6_2_ = uVar27;
  auVar10._10_2_ = uVar27;
  auVar10._8_2_ = uVar27;
  auVar10._12_2_ = uVar27;
  auVar10._14_2_ = uVar27;
  uVar27 = (undefined2)(piVar29[0x1a] << 3);
  cospi_01 = (int32_t *)CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  x_01 = (__m128i *)CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  pmulhrsw(*pauVar3,auVar10);
  auVar9._8_8_ = x_01;
  auVar9._0_8_ = cospi_01;
  pmulhrsw(*pauVar3,auVar9);
  sVar28 = (short)piVar29[0x3a] * -8;
  uVar48 = CONCAT26(sVar28,CONCAT24(sVar28,CONCAT22(sVar28,sVar28)));
  lVar49 = CONCAT26(sVar28,CONCAT24(sVar28,CONCAT22(sVar28,sVar28)));
  uVar27 = (undefined2)(piVar29[6] << 3);
  auVar7._2_2_ = uVar27;
  auVar7._0_2_ = uVar27;
  auVar7._4_2_ = uVar27;
  auVar7._6_2_ = uVar27;
  auVar7._10_2_ = uVar27;
  auVar7._8_2_ = uVar27;
  auVar7._12_2_ = uVar27;
  auVar7._14_2_ = uVar27;
  auVar8._8_8_ = lVar49;
  auVar8._0_8_ = uVar48;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 6),auVar8);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 6),auVar7);
  uVar27 = (undefined2)(piVar29[0x3c] << 3);
  auVar6._2_2_ = uVar27;
  auVar6._0_2_ = uVar27;
  auVar6._4_2_ = uVar27;
  auVar6._6_2_ = uVar27;
  auVar6._10_2_ = uVar27;
  auVar6._8_2_ = uVar27;
  auVar6._12_2_ = uVar27;
  auVar6._14_2_ = uVar27;
  uVar27 = (undefined2)(piVar29[4] << 3);
  auVar5._2_2_ = uVar27;
  auVar5._0_2_ = uVar27;
  auVar5._4_2_ = uVar27;
  auVar5._6_2_ = uVar27;
  auVar5._10_2_ = uVar27;
  auVar5._8_2_ = uVar27;
  auVar5._12_2_ = uVar27;
  auVar5._14_2_ = uVar27;
  auVar30 = pmulhrsw(*pauVar1,auVar6);
  uVar60 = auVar30._0_8_;
  uStack_c20 = auVar30._8_8_;
  auVar30 = pmulhrsw(*pauVar1,auVar5);
  sVar28 = (short)piVar29[0x24] * -8;
  lVar47 = CONCAT26(sVar28,CONCAT24(sVar28,CONCAT22(sVar28,sVar28)));
  cospi_00 = (int32_t *)CONCAT26(sVar28,CONCAT24(sVar28,CONCAT22(sVar28,sVar28)));
  uVar27 = (undefined2)(piVar29[0x1c] << 3);
  uVar45 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  lVar46 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  auVar4._8_8_ = cospi_00;
  auVar4._0_8_ = lVar47;
  auVar31 = pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x1c),auVar4);
  auVar32._8_8_ = lVar46;
  auVar32._0_8_ = uVar45;
  auVar32 = pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x1c),auVar32);
  uVar27 = (undefined2)(piVar29[0x2c] << 3);
  auVar33._2_2_ = uVar27;
  auVar33._0_2_ = uVar27;
  auVar33._4_2_ = uVar27;
  auVar33._6_2_ = uVar27;
  auVar33._10_2_ = uVar27;
  auVar33._8_2_ = uVar27;
  auVar33._12_2_ = uVar27;
  auVar33._14_2_ = uVar27;
  uVar27 = (undefined2)(piVar29[0x14] << 3);
  auVar34._2_2_ = uVar27;
  auVar34._0_2_ = uVar27;
  auVar34._4_2_ = uVar27;
  auVar34._6_2_ = uVar27;
  auVar34._10_2_ = uVar27;
  auVar34._8_2_ = uVar27;
  auVar34._12_2_ = uVar27;
  auVar34._14_2_ = uVar27;
  auVar33 = pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x14),auVar33);
  auVar34 = pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x14),auVar34);
  sVar28 = (short)piVar29[0x34] * -8;
  auVar35._2_2_ = sVar28;
  auVar35._0_2_ = sVar28;
  auVar35._4_2_ = sVar28;
  auVar35._6_2_ = sVar28;
  auVar35._10_2_ = sVar28;
  auVar35._8_2_ = sVar28;
  auVar35._12_2_ = sVar28;
  auVar35._14_2_ = sVar28;
  uVar27 = (undefined2)(piVar29[0xc] << 3);
  auVar36._2_2_ = uVar27;
  auVar36._0_2_ = uVar27;
  auVar36._4_2_ = uVar27;
  auVar36._6_2_ = uVar27;
  auVar36._10_2_ = uVar27;
  auVar36._8_2_ = uVar27;
  auVar36._12_2_ = uVar27;
  auVar36._14_2_ = uVar27;
  auVar35 = pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0xc),auVar35);
  auVar36 = pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0xc),auVar36);
  idct32_high16_stage3_sse2(in_stack_ffffffffffffef98);
  cos_bit_02 = (int8_t)((ulong)uVar54 >> 0x38);
  cos_bit_01 = (int8_t)((ulong)uVar48 >> 0x38);
  cos_bit_00 = (int8_t)((ulong)uVar45 >> 0x38);
  uVar27 = (undefined2)(piVar29[0x38] << 3);
  auVar37._2_2_ = uVar27;
  auVar37._0_2_ = uVar27;
  auVar37._4_2_ = uVar27;
  auVar37._6_2_ = uVar27;
  auVar37._10_2_ = uVar27;
  auVar37._8_2_ = uVar27;
  auVar37._12_2_ = uVar27;
  auVar37._14_2_ = uVar27;
  uVar27 = (undefined2)(piVar29[8] << 3);
  auVar41._2_2_ = uVar27;
  auVar41._0_2_ = uVar27;
  auVar41._4_2_ = uVar27;
  auVar41._6_2_ = uVar27;
  auVar41._10_2_ = uVar27;
  auVar41._8_2_ = uVar27;
  auVar41._12_2_ = uVar27;
  auVar41._14_2_ = uVar27;
  auVar37 = pmulhrsw(auVar38,auVar37);
  auVar38 = pmulhrsw(auVar43,auVar41);
  local_c38 = auVar38._0_7_;
  uVar59 = auVar38[7];
  uVar54 = auVar38._8_8_;
  sVar28 = (short)piVar29[0x28] * -8;
  auVar39._2_2_ = sVar28;
  auVar39._0_2_ = sVar28;
  auVar39._4_2_ = sVar28;
  auVar39._6_2_ = sVar28;
  auVar39._10_2_ = sVar28;
  auVar39._8_2_ = sVar28;
  auVar39._12_2_ = sVar28;
  auVar39._14_2_ = sVar28;
  uVar27 = (undefined2)(piVar29[0x18] << 3);
  auVar40._2_2_ = uVar27;
  auVar40._0_2_ = uVar27;
  auVar40._4_2_ = uVar27;
  auVar40._6_2_ = uVar27;
  auVar40._10_2_ = uVar27;
  auVar40._8_2_ = uVar27;
  auVar40._12_2_ = uVar27;
  auVar40._14_2_ = uVar27;
  auVar39 = pmulhrsw(auVar42,auVar39);
  auVar40 = pmulhrsw(auVar44,auVar40);
  output_00 = auVar31._0_8_;
  auVar24._8_8_ = uStack_c20;
  auVar24._0_8_ = uVar60;
  auVar38 = paddsw(auVar24,auVar31);
  lVar61 = auVar38._0_8_;
  auVar26._8_8_ = uStack_c20;
  auVar26._0_8_ = uVar60;
  auVar41 = psubsw(auVar26,auVar31);
  palStack_bf0 = auVar35._8_8_;
  psubsw(auVar35,auVar33);
  paddsw(auVar35,auVar33);
  paddsw(auVar36,auVar34);
  psubsw(auVar36,auVar34);
  psubsw(auVar30,auVar32);
  paddsw(auVar30,auVar32);
  __rounding_02[1] = lVar53;
  __rounding_02[0] = lVar52;
  idct32_high16_stage4_sse2(x_02,cospi_02,__rounding_02,(int8_t)((ulong)uVar51 >> 0x38));
  uVar27 = (undefined2)(piVar29[0x20] << 3);
  auVar30._2_2_ = uVar27;
  auVar30._0_2_ = uVar27;
  auVar30._4_2_ = uVar27;
  auVar30._6_2_ = uVar27;
  auVar30._10_2_ = uVar27;
  auVar30._8_2_ = uVar27;
  auVar30._12_2_ = uVar27;
  auVar30._14_2_ = uVar27;
  uVar27 = (undefined2)(piVar29[0x20] << 3);
  auVar42._2_2_ = uVar27;
  auVar42._0_2_ = uVar27;
  auVar42._4_2_ = uVar27;
  auVar42._6_2_ = uVar27;
  auVar42._10_2_ = uVar27;
  auVar42._8_2_ = uVar27;
  auVar42._12_2_ = uVar27;
  auVar42._14_2_ = uVar27;
  auVar31._8_8_ = uVar58;
  auVar31._0_8_ = uVar57;
  auVar30 = pmulhrsw(auVar31,auVar30);
  auVar44._8_8_ = uVar58;
  auVar44._0_8_ = uVar57;
  auVar42 = pmulhrsw(auVar44,auVar42);
  uVar27 = (undefined2)(piVar29[0x30] << 3);
  auVar43._2_2_ = uVar27;
  auVar43._0_2_ = uVar27;
  auVar43._4_2_ = uVar27;
  auVar43._6_2_ = uVar27;
  auVar43._10_2_ = uVar27;
  auVar43._8_2_ = uVar27;
  auVar43._12_2_ = uVar27;
  auVar43._14_2_ = uVar27;
  uVar27 = (undefined2)(piVar29[0x10] << 3);
  auVar38._2_2_ = uVar27;
  auVar38._0_2_ = uVar27;
  auVar38._4_2_ = uVar27;
  auVar38._6_2_ = uVar27;
  auVar38._10_2_ = uVar27;
  auVar38._8_2_ = uVar27;
  auVar38._12_2_ = uVar27;
  auVar38._14_2_ = uVar27;
  auVar43 = pmulhrsw(auVar23,auVar43);
  auVar38 = pmulhrsw(auVar25,auVar38);
  paddsw(auVar37,auVar39);
  psubsw(auVar37,auVar39);
  auVar25._8_8_ = uVar54;
  auVar25._0_8_ = CONCAT17(uVar59,local_c38);
  psubsw(auVar25,auVar40);
  auVar23._8_8_ = uVar54;
  auVar23._0_8_ = CONCAT17(uVar59,local_c38);
  auVar44 = paddsw(auVar23,auVar40);
  cos_bit_03 = auVar44[7];
  lVar53 = auVar44._8_8_;
  __rounding_00[1] = lVar47;
  __rounding_00[0] = lVar46;
  idct32_high24_stage5_sse2(x_00,cospi_00,__rounding_00,cos_bit_00);
  auVar44 = paddsw(auVar30,auVar38);
  psubsw(auVar30,auVar38);
  paddsw(auVar42,auVar43);
  psubsw(auVar42,auVar43);
  __rounding_04[1] = lVar61;
  __rounding_04[0] = lVar53;
  idct32_high28_stage6_sse2(auVar41._8_8_,auVar41._0_8_,__rounding_04,cos_bit_03);
  __rounding_01[1] = lVar50;
  __rounding_01[0] = lVar49;
  idct32_stage7_sse2(x_01,cospi_01,__rounding_01,cos_bit_01);
  __rounding_03[1] = lVar56;
  __rounding_03[0] = lVar55;
  idct32_stage8_sse2(auVar44._8_8_,auVar44._0_8_,__rounding_03,cos_bit_02);
  idct32_stage9_sse2(output_00,palStack_bf0);
  return;
}

Assistant:

static void idct32_low16_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m128i x[32];
  x[0] = input[0];
  x[2] = input[8];
  x[4] = input[4];
  x[6] = input[12];
  x[8] = input[2];
  x[10] = input[10];
  x[12] = input[6];
  x[14] = input[14];
  x[16] = input[1];
  x[18] = input[9];
  x[20] = input[5];
  x[22] = input[13];
  x[24] = input[3];
  x[26] = input[11];
  x[28] = input[7];
  x[30] = input[15];

  // stage 2
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_ssse3(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_ssse3(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);

  // stage 3
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_ssse3(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  idct32_high16_stage3_sse2(x);

  // stage 4
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_ssse3(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);
  idct32_high16_stage4_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_ssse3(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  idct32_high24_stage5_sse2(x, cospi, __rounding, cos_bit);

  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  idct32_high28_stage6_sse2(x, cospi, __rounding, cos_bit);

  idct32_stage7_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage8_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage9_sse2(output, x);
}